

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_>::MultAddTBB
          (TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_> *this,TPZFMatrix<float> *x,
          TPZFMatrix<float> *y,TPZFMatrix<float> *z,float alpha,float beta,int opt)

{
  int opt_local;
  float beta_local;
  float alpha_local;
  TPZFMatrix<float> *z_local;
  TPZFMatrix<float> *y_local;
  TPZFMatrix<float> *x_local;
  TPZDohrPrecond<float,_TPZDohrSubstructCondense<float>_> *this_local;
  
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::MultAddTBB(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {

#ifdef USING_TBB
    if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		this->Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}

	int64_t rows = this->Rows();
	int64_t cols = this->Cols();
	this->PrepareZ(y,z,beta,opt);
    
    TPZFMatrix<TVar> v1(rows,x.Cols(),0.);
	TPZFMatrix<TVar> v2(cols,x.Cols(),0.);

    std::vector<thread> AllThreads(2);
    TPZDohrPrecondThreadV1Data<TVar,TSubStruct> v1threaddata(this,x,v1);
    AllThreads[0] = thread((TPZDohrPrecondThreadV1Data<TVar,TSubStruct>::ComputeV1),
                           &v1threaddata);

    TPZAutoPointer<TPZDohrAssembleList<TVar> > assemblelist = new TPZDohrAssembleList<TVar>(fGlobal.size(),v2,this->fAssemble);
    
    ParallelAssembleTask<TVar, TSubStruct> tbb_work(assemblelist);
    
    typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
    
    int isub=0;
    /** Cria tarefa que execute a distribuicao de cada elemento do fGlobal */
    for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
    {
        TPZFMatrix<TVar> *Residual_local = new TPZFMatrix<TVar>;
        fAssemble->Extract(isub,x,*Residual_local);
        TPZDohrPrecondV2SubData<TVar,TSubStruct> data(isub,*it,Residual_local);
        tbb_work.addWorkItem(data);
    }
    

    tbb_work.run_parallel_for(pzenviroment.fSubstructurePartitioner);

    AllThreads[1] = thread(TPZDohrAssembleList<TVar>::Assemble,
                           assemblelist.operator->());

    for (int i=0; i<2; i++) {
        AllThreads[i].join();
    }
    
    v2 += v1;

	/** Soma v1+v2+v3 com z */
    int64_t xcols = x.Cols();
    for (int64_t ic=0; ic<xcols; ic++)
    {
        for (int64_t c=0; c<rows; c++) {
            z(c,ic) += v2(c,ic);
        }
    }

#endif
}